

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.hxx
# Opt level: O2

void __thiscall
nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>::~cmd_result
          (cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_> *this)

{
  std::condition_variable::~condition_variable(&this->cv_);
  std::_Function_base::~_Function_base(&(this->handler2_).super__Function_base);
  std::_Function_base::~_Function_base(&(this->handler_).super__Function_base);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->err_).super___shared_ptr<std::exception,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->result_).super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->empty_result_).super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

~cmd_result() {}